

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall printing_callbacks::on_string(printing_callbacks *this,string *value)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"string: ");
  poVar1 = std::operator<<(poVar1,(string *)value);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void on_string(const std::string& value)
    {
        std::cout << "string: " << value << std::endl;
    }